

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Matcher::Matcher(Matcher *this,ScriptContext *scriptContext,RegexPattern *pattern)

{
  StandardChars<char16_t> *ptr;
  Recycler *pRVar1;
  GroupInfo *ptr_00;
  LoopInfo *ptr_01;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet(&this->pattern,pattern);
  ptr = ThreadContext::GetStandardChars(scriptContext->threadContext,(char16 *)0x0);
  Memory::WriteBarrierPtr<UnifiedRegex::StandardChars<char16_t>_>::WriteBarrierSet
            (&this->standardChars,ptr);
  Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::WriteBarrierSet
            (&this->program,(pattern->rep).unified.program.ptr);
  (this->literalNextSyncInputOffsets).ptr = (uint *)0x0;
  (this->groupInfos).ptr = (GroupInfo *)0x0;
  (this->loopInfos).ptr = (LoopInfo *)0x0;
  pRVar1 = scriptContext->recycler;
  this->recycler = pRVar1;
  this->previousQcTime = 0;
  this->stats = (Type)0x0;
  this->w = (Type)0x0;
  data.plusSize = (size_t)((this->program).ptr)->numGroups;
  local_50 = (undefined1  [8])&GroupInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_a63c962;
  data.filename._0_4_ = 0x1344;
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,(TrackAllocData *)local_50);
  ptr_00 = Memory::AllocateArray<Memory::Recycler,UnifiedRegex::GroupInfo,false>
                     ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeaf,0,
                      (ulong)((this->program).ptr)->numGroups);
  Memory::WriteBarrierPtr<UnifiedRegex::GroupInfo>::WriteBarrierSet(&this->groupInfos,ptr_00);
  data.plusSize = (size_t)((this->program).ptr)->numLoops;
  if (0 < (long)data.plusSize) {
    local_50 = (undefined1  [8])&LoopInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_a63c962;
    data.filename._0_4_ = 0x1348;
    pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    ptr_01 = Memory::AllocateArray<Memory::Recycler,UnifiedRegex::LoopInfo,false>
                       ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                        (long)((this->program).ptr)->numLoops);
    Memory::WriteBarrierPtr<UnifiedRegex::LoopInfo>::WriteBarrierSet(&this->loopInfos,ptr_01);
  }
  return;
}

Assistant:

Matcher::Matcher(Js::ScriptContext* scriptContext, RegexPattern* pattern)
        : pattern(pattern)
        , standardChars(scriptContext->GetThreadContext()->GetStandardChars((char16*)0))
        , program(pattern->rep.unified.program)
        , groupInfos(nullptr)
        , loopInfos(nullptr)
        , literalNextSyncInputOffsets(nullptr)
        , recycler(scriptContext->GetRecycler())
        , previousQcTime(0)
#if ENABLE_REGEX_CONFIG_OPTIONS
        , stats(0)
        , w(0)
#endif
    {
        // Don't need to zero out - the constructor for GroupInfo should take care of it
        groupInfos = RecyclerNewArrayLeaf(recycler, GroupInfo, program->numGroups);

        if (program->numLoops > 0)
        {
            loopInfos = RecyclerNewArrayLeafZ(recycler, LoopInfo, program->numLoops);
        }
    }